

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

StringPtr * __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this,
          StringPtr *row)

{
  RemoveConst<kj::StringPtr> *pRVar1;
  StringPtr *pSVar2;
  RemoveConst<kj::StringPtr> *pRVar3;
  size_t sVar4;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,this,(long)(this->rows).builder.pos - (long)(this->rows).builder.ptr >> 4,row,
             0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pRVar3 = (this->rows).builder.pos;
    if (pRVar3 == (this->rows).builder.endPtr) {
      pRVar1 = (this->rows).builder.ptr;
      sVar4 = 4;
      if (pRVar3 != pRVar1) {
        sVar4 = (long)pRVar3 - (long)pRVar1 >> 3;
      }
      Vector<kj::StringPtr>::setCapacity(&this->rows,sVar4);
      pRVar3 = (this->rows).builder.pos;
    }
    sVar4 = (row->content).size_;
    (pRVar3->content).ptr = (row->content).ptr;
    (pRVar3->content).size_ = sVar4;
    pSVar2 = (this->rows).builder.pos;
    (this->rows).builder.pos = pSVar2 + 1;
    return pSVar2;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }